

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

target_ulong helper_load_sr_ppc64(CPUPPCState_conflict2 *env,target_ulong sr_num)

{
  target_ulong sr_num_local;
  CPUPPCState_conflict2 *env_local;
  
  if ((env->mmu_model & 0x10000) == POWERPC_MMU_UNKNOWN) {
    env_local = (CPUPPCState_conflict2 *)env->sr[sr_num];
  }
  else {
    env_local = (CPUPPCState_conflict2 *)0x0;
  }
  return (target_ulong)env_local;
}

Assistant:

target_ulong helper_load_sr(CPUPPCState *env, target_ulong sr_num)
{
#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        /* XXX */
        return 0;
    }
#endif
    return env->sr[sr_num];
}